

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O3

void lj_gc_fullgc(lua_State *L)

{
  uint uVar1;
  undefined4 uVar2;
  ulong uVar3;
  
  uVar1 = (L->glref).ptr32;
  uVar3 = (ulong)uVar1;
  uVar2 = *(undefined4 *)(uVar3 + 0x160);
  *(undefined4 *)(uVar3 + 0x160) = 0xfffffffb;
  if (*(byte *)(uVar3 + 0x59) < 3) {
    *(uint *)(uVar3 + 100) = uVar1 + 0x60;
    *(undefined8 *)(uVar3 + 0x68) = 0;
    *(undefined4 *)(uVar3 + 0x70) = 0;
    *(undefined1 *)(uVar3 + 0x59) = 3;
    *(undefined4 *)(uVar3 + 0x5c) = 0;
  }
  else if (1 < (byte)(*(byte *)(uVar3 + 0x59) - 3)) goto LAB_001156ad;
  do {
    gc_onestep(L);
  } while ((byte)(*(char *)(uVar3 + 0x59) - 3U) < 2);
LAB_001156ad:
  *(undefined1 *)(uVar3 + 0x59) = 0;
  do {
    gc_onestep(L);
  } while (*(char *)(uVar3 + 0x59) != '\0');
  *(uint *)(uVar3 + 0x54) = (*(uint *)(uVar3 + 0x7c) / 100) * *(int *)(uVar3 + 0x84);
  *(undefined4 *)(uVar3 + 0x160) = uVar2;
  return;
}

Assistant:

void lj_gc_fullgc(lua_State *L)
{
  global_State *g = G(L);
  int32_t ostate = g->vmstate;
  setvmstate(g, GC);
  if (g->gc.state <= GCSatomic) {  /* Caught somewhere in the middle. */
    setmref(g->gc.sweep, &g->gc.root);  /* Sweep everything (preserving it). */
    setgcrefnull(g->gc.gray);  /* Reset lists from partial propagation. */
    setgcrefnull(g->gc.grayagain);
    setgcrefnull(g->gc.weak);
    g->gc.state = GCSsweepstring;  /* Fast forward to the sweep phase. */
    g->gc.sweepstr = 0;
  }
  while (g->gc.state == GCSsweepstring || g->gc.state == GCSsweep)
    gc_onestep(L);  /* Finish sweep. */
  lj_assertG(g->gc.state == GCSfinalize || g->gc.state == GCSpause,
	     "bad GC state");
  /* Now perform a full GC. */
  g->gc.state = GCSpause;
  do { gc_onestep(L); } while (g->gc.state != GCSpause);
  g->gc.threshold = (g->gc.estimate/100) * g->gc.pause;
  g->vmstate = ostate;
}